

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemView::isPersistentEditorOpen(QAbstractItemView *this,QModelIndex *index)

{
  QWidget *pQVar1;
  QAbstractItemViewPrivate *d;
  
  d_func((QAbstractItemView *)0x80cfcc);
  QAbstractItemViewPrivate::editorForIndex((QAbstractItemViewPrivate *)index,(QModelIndex *)d);
  pQVar1 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x80cfe6);
  return pQVar1 != (QWidget *)0x0;
}

Assistant:

bool QAbstractItemView::isPersistentEditorOpen(const QModelIndex &index) const
{
    Q_D(const QAbstractItemView);
    return d->editorForIndex(index).widget;
}